

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

DHUDMessage * __thiscall DBaseStatusBar::DetachMessage(DBaseStatusBar *this,DHUDMessage *msg)

{
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 *paVar1;
  long lVar2;
  DHUDMessage *pDVar3;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 aVar4;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 aVar5;
  
  lVar2 = 0;
  do {
    aVar5 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)this->Messages[lVar2].field_0.p;
    if (aVar5 != (DHUDMessage *)0x0) {
      paVar1 = &this->Messages[lVar2].field_0;
      if ((*(byte *)((long)aVar5 + 0x20) & 0x20) == 0) {
        if (aVar5 == (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)msg) {
LAB_004ce08d:
          pDVar3 = ((aVar5.p)->Next).field_0.p;
          if (pDVar3 != (DHUDMessage *)0x0) {
            if (((pDVar3->super_DObject).ObjectFlags & 0x20) == 0) goto LAB_004ce0ac;
            ((aVar5.p)->Next).field_0.p = (DHUDMessage *)0x0;
          }
          pDVar3 = (DHUDMessage *)0x0;
LAB_004ce0ac:
          paVar1->p = pDVar3;
          ((aVar5.p)->Next).field_0.p = (DHUDMessage *)0x0;
          if (screen == (DFrameBuffer *)0x0) {
            return aVar5.p;
          }
          if (StatusBar != (DBaseStatusBar *)0x0) {
            SB_state = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject
                         [0x20])();
            return aVar5.p;
          }
          SB_state = 0;
          return aVar5.p;
        }
        while (aVar4 = aVar5,
              aVar5 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)
                      (((TObjPtr<DHUDMessage> *)&aVar4.o[4].Class)->field_0).p,
              aVar5.p != (DHUDMessage *)0x0) {
          if ((((aVar5.p)->super_DObject).ObjectFlags & 0x20) != 0) {
            paVar1 = &((aVar4.p)->Next).field_0;
            goto LAB_004ce073;
          }
          if (aVar5.p == msg) {
            paVar1 = &((aVar4.p)->Next).field_0;
            goto LAB_004ce08d;
          }
        }
      }
      else {
LAB_004ce073:
        paVar1->p = (DHUDMessage *)0x0;
      }
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 3) {
      return (DHUDMessage *)0x0;
    }
  } while( true );
}

Assistant:

DHUDMessage *DBaseStatusBar::DetachMessage (DHUDMessage *msg)
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *probe = Messages[i];
		DHUDMessage **prev = &Messages[i];

		while (probe && probe != msg)
		{
			prev = &probe->Next;
			probe = probe->Next;
		}
		if (probe != NULL)
		{
			*prev = probe->Next;
			probe->Next = NULL;
			// Redraw the status bar in case it was covered
			if (screen != NULL)
			{
				ST_SetNeedRefresh();
			}
			return probe;
		}
	}
	return NULL;
}